

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O0

shared_ptr<helics::Broker> helics::BrokerFactory::findBroker(string_view brokerName)

{
  bool bVar1;
  const_reference pvVar2;
  const_pointer pvVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<helics::Broker> sVar4;
  unsigned_long_long val;
  char *ept;
  shared_ptr<helics::Broker> brk;
  shared_ptr<helics::Broker> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  shared_ptr<helics::Broker> *this;
  undefined1 *index;
  shared_ptr<helics::Broker> *local_68;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  SearchableObjectHolder<helics::Core,_helics::CoreType> *in_stack_ffffffffffffffb8;
  __shared_ptr local_28 [16];
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  index = &stack0xffffffffffffffb7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::findObject
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(in_stack_ffffffffffffff70);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_28);
  if (bVar1) {
    std::shared_ptr<helics::Broker>::shared_ptr
              ((shared_ptr<helics::Broker> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
    if (bVar1) {
      getConnectedBroker();
    }
    else {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(&local_18);
      if (*pvVar2 == '#') {
        local_68 = (shared_ptr<helics::Broker> *)0x0;
        pvVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data
                           ((basic_string_view<char,_std::char_traits<char>_> *)&local_18);
        strtoull(pvVar3 + 1,(char **)&local_68,10);
        this = local_68;
        pvVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data
                           ((basic_string_view<char,_std::char_traits<char>_> *)&local_18);
        if ((shared_ptr<helics::Broker> *)(pvVar3 + 1) < this) {
          getBrokerByIndex((size_t)index);
        }
        else {
          std::shared_ptr<helics::Broker>::shared_ptr(this,in_stack_ffffffffffffff68);
        }
      }
      else {
        std::shared_ptr<helics::Broker>::shared_ptr
                  ((shared_ptr<helics::Broker> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68
                  );
      }
    }
  }
  std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x4644c9);
  sVar4.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<helics::Broker>)
         sVar4.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Broker> findBroker(std::string_view brokerName)
{
    auto brk = searchableBrokers.findObject(std::string(brokerName));
    if (brk) {
        return brk;
    }
    if (brokerName.empty()) {
        return getConnectedBroker();
    }
    if (brokerName.front() == '#') {
        char* ept = nullptr;
        auto val = std::strtoull(brokerName.data() + 1, &ept, 10);
        return (ept > brokerName.data() + 1) ? getBrokerByIndex(val) : nullptr;
    }
    return nullptr;
}